

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetector.cpp
# Opt level: O0

void __thiscall
MemoryLeakDetector::ConstructMemoryLeakReport(MemoryLeakDetector *this,MemLeakPeriod period)

{
  MemoryLeakDetectorNode *pMVar1;
  undefined4 in_ESI;
  MemoryLeakOutputStringBuffer *in_RDI;
  MemoryLeakDetectorNode *leak;
  undefined4 in_stack_00000018;
  MemoryLeakDetectorTable *in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff0;
  MemoryLeakOutputStringBuffer *this_00;
  
  this_00 = in_RDI;
  pMVar1 = MemoryLeakDetectorTable::getFirstLeak
                     (in_stack_ffffffffffffffe8,(MemLeakPeriod)((ulong)in_RDI >> 0x20));
  MemoryLeakOutputStringBuffer::startMemoryLeakReporting(in_RDI);
  for (; pMVar1 != (MemoryLeakDetectorNode *)0x0;
      pMVar1 = MemoryLeakDetectorTable::getNextLeak
                         ((MemoryLeakDetectorTable *)this_00,
                          (MemoryLeakDetectorNode *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
                          (MemLeakPeriod)((ulong)pMVar1 >> 0x20))) {
    MemoryLeakOutputStringBuffer::reportMemoryLeak
              ((MemoryLeakOutputStringBuffer *)this,
               (MemoryLeakDetectorNode *)CONCAT44(period,in_stack_00000018));
  }
  MemoryLeakOutputStringBuffer::stopMemoryLeakReporting(in_RDI);
  return;
}

Assistant:

void MemoryLeakDetector::ConstructMemoryLeakReport(MemLeakPeriod period)
{
    MemoryLeakDetectorNode* leak = memoryTable_.getFirstLeak(period);

    outputBuffer_.startMemoryLeakReporting();

    while (leak) {
        outputBuffer_.reportMemoryLeak(leak);
        leak = memoryTable_.getNextLeak(leak, period);
    }

    outputBuffer_.stopMemoryLeakReporting();
}